

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharContent.h
# Opt level: O0

void __thiscall CharContent::CharContent(CharContent *this,CharContent *cc)

{
  char *pcVar1;
  size_t n;
  CharContent *cc_local;
  CharContent *this_local;
  
  this->_vptr_CharContent = (_func_int **)&PTR__CharContent_00132c18;
  this->npos = 0xffffffffffffffff;
  pcVar1 = (char *)operator_new__(cc->m_length);
  this->m = pcVar1;
  this->size = cc->size;
  this->m_length = cc->m_length;
  memset(this->m,0,this->m_length);
  memmove(this->m,cc->m,cc->m_length);
  return;
}

Assistant:

CharContent(const CharContent &cc){
        size_t n=cc.m_length;
        m=new char [n];
        size=cc.size;
        m_length=cc.m_length;
        memset(m,'\0',m_length);
        memmove(m,cc.m,cc.m_length);
    }